

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

shared_ptr<chaiscript::dispatch::Proxy_Function_Base> __thiscall
chaiscript::
make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)>,chaiscript::Boxed_Value(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)>
          (chaiscript *this,
          _func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
          **arg)

{
  _func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
  *t_f;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  allocator local_99;
  AST_NodePtr local_98;
  Proxy_Function local_88;
  Param_Types local_78;
  string local_40;
  
  this_00 = (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
             *)operator_new(0xa8);
  t_f = *arg;
  local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78._17_8_ = 0;
  local_78.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_78.m_doti.m_type_info = (type_info *)&dispatch::Dynamic_Object::typeinfo;
  local_78.m_doti.m_bare_type_info = (type_info *)&dispatch::Dynamic_Object::typeinfo;
  local_78.m_doti.m_flags = 0;
  std::__cxx11::string::string((string *)&local_40,"",&local_99);
  local_88.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
  ::Dynamic_Proxy_Function_Impl(this_00,t_f,-1,&local_98,&local_78,&local_40,&local_88);
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             this,(Proxy_Function_Base *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_78.m_types);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }